

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  BYTE *pBVar3;
  byte bVar4;
  byte bVar5;
  undefined2 uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  sbyte sVar10;
  int iVar11;
  BIT_DStream_status BVar12;
  size_t sVar13;
  long lVar14;
  size_t sVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  BYTE *pBVar19;
  ulong uVar20;
  undefined1 *puVar21;
  int iVar22;
  ulong uVar23;
  ulong *puVar24;
  long lVar25;
  byte *srcBuffer;
  int iVar26;
  BYTE *pBVar27;
  int iVar28;
  char cVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 *puVar35;
  ulong uVar36;
  BYTE *pBVar37;
  size_t *psVar38;
  undefined1 *puVar39;
  bool bVar40;
  BYTE *pStart;
  U64 bits [4];
  BYTE *ip [4];
  HUF_DecompressFastArgs args;
  uint local_214;
  undefined1 *local_210;
  BIT_DStream_t local_208;
  BYTE *local_1d8;
  uint local_1cc;
  undefined1 local_1c8 [16];
  ulong *local_1b8;
  ulong *puStack_1b0;
  ulong *local_1a8;
  undefined1 *local_198;
  ulong local_190;
  undefined1 local_188 [8];
  BYTE *pBStack_180;
  size_t *local_178;
  size_t *psStack_170;
  size_t *local_168;
  ulong local_160;
  undefined1 *local_158;
  ulong *local_150;
  size_t local_148;
  ulong *local_140;
  size_t local_138;
  ulong local_130;
  size_t *local_128;
  ulong *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  HUF_DecompressFastArgs local_108;
  ulong *local_68;
  undefined1 *local_60;
  ulong *local_58;
  size_t *local_50;
  ulong local_48;
  ulong *local_40;
  ulong *local_38;
  
  local_148 = dstSize;
  if ((flags & 0x20U) == 0) {
    sVar13 = HUF_DecompressFastArgs_init(&local_108,dst,dstSize,cSrc,cSrcSize,DTable);
    if (sVar13 - 1 < 0xffffffffffffff88) {
      if (local_108.ip[0] < local_108.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x329,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      pBVar37 = (BYTE *)((long)cSrc + 6);
      pBVar3 = (BYTE *)((long)dst + dstSize);
      local_208.bitContainer = local_108.bits[0];
      local_208._8_8_ = local_108.bits[1];
      local_208.ptr = (char *)local_108.bits[2];
      local_208.start = (char *)local_108.bits[3];
      local_1c8._0_8_ = local_108.ip[0];
      local_1c8._8_8_ = local_108.ip[1];
      local_1b8 = (ulong *)local_108.ip[2];
      puStack_1b0 = (ulong *)local_108.ip[3];
      local_188 = (undefined1  [8])local_108.op[0];
      pBStack_180 = local_108.op[1];
      local_178 = (size_t *)local_108.op[2];
      psStack_170 = (size_t *)local_108.op[3];
      lVar14 = 0;
      while( true ) {
        do {
          pBVar19 = local_108.oend;
          if (lVar14 != 3) {
            pBVar19 = (&pBStack_180)[lVar14];
          }
          if (pBVar19 < *(BYTE **)(local_188 + lVar14 * 8)) {
            __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2c9,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          if (*(BYTE **)(local_1c8 + lVar14 * 8) < local_108.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2ca,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        uVar17 = (ulong)((long)local_108.oend - (long)psStack_170) / 5;
        uVar23 = (ulong)(local_1c8._0_8_ - (long)local_108.ilimit) / 7;
        if (uVar17 < uVar23) {
          uVar23 = uVar17;
        }
        if (((((long)(uVar23 * 5) < 0x14) || ((ulong)local_1c8._8_8_ < (ulong)local_1c8._0_8_)) ||
            (local_1b8 < (ulong)local_1c8._8_8_)) || (puStack_1b0 < local_1b8)) break;
        pBVar19 = (BYTE *)((long)psStack_170 + uVar23 * 5);
        lVar18 = 0;
        do {
          do {
            lVar14 = 0;
            do {
              uVar6 = *(undefined2 *)
                       ((long)local_108.dt + ((&local_208.bitContainer)[lVar14] >> 0x35) * 2);
              (&local_208.bitContainer)[lVar14] =
                   (&local_208.bitContainer)[lVar14] << ((byte)uVar6 & 0x3f);
              *(char *)(*(long *)(local_188 + lVar14 * 8) + lVar18) = (char)((ushort)uVar6 >> 8);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 4);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 5);
          lVar14 = 0;
          do {
            uVar23 = (&local_208.bitContainer)[lVar14];
            if (uVar23 == 0) {
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                            ,0x5c,"unsigned int ZSTD_countTrailingZeros64(U64)");
            }
            uVar17 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            *(long *)(local_188 + lVar14 * 8) = *(long *)(local_188 + lVar14 * 8) + 5;
            puVar24 = (ulong *)(*(long *)(local_1c8 + lVar14 * 8) - (uVar17 >> 3 & 0x1fffffff));
            *(ulong **)(local_1c8 + lVar14 * 8) = puVar24;
            (&local_208.bitContainer)[lVar14] = (*puVar24 | 1) << ((byte)uVar17 & 7);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          lVar14 = 0;
          lVar18 = 0;
        } while (psStack_170 < pBVar19);
      }
      local_108.bits[2] = (U64)local_208.ptr;
      local_108.bits[3] = (U64)local_208.start;
      local_108.bits[0] = local_208.bitContainer;
      local_108.bits[1] = local_208._8_8_;
      local_108.ip[0] = (BYTE *)local_1c8._0_8_;
      local_108.ip[1] = (BYTE *)local_1c8._8_8_;
      local_108.ip[2] = (BYTE *)local_1b8;
      local_108.ip[3] = (BYTE *)puStack_1b0;
      local_108.op[2] = (BYTE *)local_178;
      local_108.op[3] = (BYTE *)psStack_170;
      local_108.op[0] = (BYTE *)local_188;
      local_108.op[1] = pBStack_180;
      if ((ulong)local_1c8._0_8_ < pBVar37) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x32f,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if ((ulong)local_1c8._8_8_ < pBVar37) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x330,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_1b8 < pBVar37) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x331,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (puStack_1b0 < pBVar37) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x332,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (pBVar3 < psStack_170) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x333,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      pBVar37 = (BYTE *)(dstSize + 3 >> 2);
      lVar14 = 0;
      local_1d8 = pBVar37;
LAB_002225a1:
      uVar23 = (long)pBVar3 - (long)dst;
      dst = (BYTE *)((long)dst + (long)pBVar37);
      if (uVar23 < pBVar37) {
        dst = pBVar3;
      }
      sVar13 = HUF_initRemainingDStream(&local_208,&local_108,(int)lVar14,(BYTE *)dst);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
      pBVar19 = local_108.op[lVar14];
      lVar18 = (long)dst - (long)pBVar19;
      pBVar27 = pBVar19;
      if (3 < lVar18) {
        if (local_208.bitsConsumed < 0x41) {
          do {
            if (local_208.ptr < local_208.limitPtr) {
              if (local_208.ptr == local_208.start) goto LAB_00222735;
              bVar40 = local_208.start <=
                       (U64 *)((long)local_208.ptr - (ulong)(local_208.bitsConsumed >> 3));
              uVar30 = (int)local_208.ptr - (int)local_208.start;
              if (bVar40) {
                uVar30 = local_208.bitsConsumed >> 3;
              }
              local_208.bitsConsumed = local_208.bitsConsumed + uVar30 * -8;
            }
            else {
              uVar30 = local_208.bitsConsumed >> 3;
              local_208.bitsConsumed = local_208.bitsConsumed & 7;
              bVar40 = true;
            }
            local_208.ptr = (char *)((long)local_208.ptr - (ulong)uVar30);
            local_208.bitContainer = *(size_t *)local_208.ptr;
            if (((BYTE *)((long)dst + -3) <= pBVar27) || (!bVar40)) goto LAB_00222735;
            uVar23 = (local_208.bitContainer << ((byte)local_208.bitsConsumed & 0x3f)) >> 0x35;
            iVar11 = *(byte *)((long)DTable + uVar23 * 2 + 4) + local_208.bitsConsumed;
            *pBVar27 = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
            uVar23 = (local_208.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            iVar11 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
            pBVar27[1] = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
            uVar23 = (local_208.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            iVar11 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
            pBVar27[2] = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
            uVar23 = (local_208.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            local_208.bitsConsumed = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
            pBVar27[3] = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
            pBVar27 = pBVar27 + 4;
            if (0x40 < local_208.bitsConsumed) goto LAB_00222735;
          } while( true );
        }
        goto LAB_00222747;
      }
      if (local_208.bitsConsumed < 0x41) {
        if (local_208.ptr < local_208.limitPtr) {
          if (local_208.ptr == local_208.start) goto LAB_00222776;
          uVar30 = (int)local_208.ptr - (int)local_208.start;
          if (local_208.start <= (U64 *)((long)local_208.ptr - (ulong)(local_208.bitsConsumed >> 3))
             ) {
            uVar30 = local_208.bitsConsumed >> 3;
          }
          local_208.ptr = (char *)((long)local_208.ptr - (ulong)uVar30);
          local_208.bitsConsumed = local_208.bitsConsumed + uVar30 * -8;
        }
        else {
          local_208.ptr = (char *)((long)local_208.ptr - (ulong)(local_208.bitsConsumed >> 3));
          local_208.bitsConsumed = local_208.bitsConsumed & 7;
        }
        local_208.bitContainer = *(U64 *)local_208.ptr;
      }
      goto LAB_00222776;
    }
    if (sVar13 != 0) {
      return sVar13;
    }
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar7 = *cSrc;
  uVar23 = (ulong)uVar7;
  uVar8 = *(ushort *)((long)cSrc + 2);
  uVar9 = *(ushort *)((long)cSrc + 4);
  uVar17 = uVar23 + uVar8 + (ulong)uVar9 + 6;
  if ((dstSize < 6) || (cSrcSize < uVar17)) {
LAB_002232fd:
    sVar13 = 0xffffffffffffffec;
  }
  else {
    local_198 = (undefined1 *)((long)dst + dstSize);
    uVar20 = dstSize + 3 >> 2;
    local_110 = (undefined1 *)((long)dst + uVar20);
    local_158 = local_110 + uVar20;
    local_118 = local_158 + uVar20;
    if (local_198 < local_118) goto LAB_002232fd;
    if (uVar7 != 0) {
      local_108.ip[3] = (BYTE *)((long)cSrc + 6);
      local_208.start = (char *)((long)cSrc + uVar23 + 6);
      local_190 = (ulong)*(ushort *)((long)DTable + 2);
      local_108.op[0] = (BYTE *)((long)cSrc + 0xe);
      if (uVar7 < 8) {
        local_108.ip[0] = (BYTE *)(ulong)*local_108.ip[3];
        switch(uVar7) {
        case 2:
          goto LAB_00222896;
        case 3:
          goto LAB_0022288b;
        case 4:
          break;
        case 7:
          local_108.ip[0] =
               (BYTE *)((ulong)local_108.ip[0] | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30);
        case 6:
          local_108.ip[0] = local_108.ip[0] + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
        case 5:
          local_108.ip[0] = local_108.ip[0] + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
          break;
        default:
          goto switchD_0022283f_default;
        }
        local_108.ip[0] = local_108.ip[0] + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_0022288b:
        local_108.ip[0] = local_108.ip[0] + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_00222896:
        local_108.ip[0] = local_108.ip[0] + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
switchD_0022283f_default:
        bVar16 = *(byte *)((long)cSrc + uVar23 + 5);
        if (bVar16 == 0) goto LAB_002232fd;
        uVar30 = 0x1f;
        if (bVar16 != 0) {
          for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
          }
        }
        local_214 = (uVar30 ^ 0x1f) + (uint)uVar7 * -8 + 0x29;
        local_108.ip[2] = local_108.ip[3];
      }
      else {
        local_108.ip[0] = *(BYTE **)((long)cSrc + (uVar23 - 2));
        if ((ulong)local_108.ip[0] >> 0x38 == 0) {
          return 0xffffffffffffffff;
        }
        uVar30 = 0x1f;
        bVar16 = (byte)((ulong)local_108.ip[0] >> 0x38);
        if (bVar16 != 0) {
          for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
          }
        }
        local_214 = ~uVar30 + 9;
        local_108.ip[2] = (BYTE *)((long)cSrc + (uVar23 - 2));
      }
      if (uVar8 != 0) {
        puStack_1b0 = (ulong *)((ulong)uVar8 + (long)local_208.start);
        local_208.limitPtr = (char *)((long)cSrc + uVar23 + 0xe);
        if (uVar8 < 8) {
          local_208.bitContainer = (size_t)(byte)*(ulong *)local_208.start;
          switch(uVar8) {
          case 7:
            local_208.bitContainer =
                 local_208.bitContainer | (ulong)*(byte *)((long)cSrc + uVar23 + 0xc) << 0x30;
          case 6:
            local_208.bitContainer =
                 local_208.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar23 + 0xb) << 0x28);
          case 5:
            local_208.bitContainer =
                 local_208.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar23 + 10) << 0x20);
          case 4:
            local_208.bitContainer =
                 local_208.bitContainer + (ulong)*(byte *)((long)cSrc + uVar23 + 9) * 0x1000000;
          case 3:
            local_208.bitContainer =
                 local_208.bitContainer + (ulong)*(byte *)((long)cSrc + uVar23 + 8) * 0x10000;
          case 2:
            local_208.bitContainer =
                 local_208.bitContainer + (ulong)*(byte *)((long)cSrc + uVar23 + 7) * 0x100;
          }
          bVar16 = *(byte *)((long)puStack_1b0 + -1);
          if (bVar16 == 0) goto LAB_002232fd;
          uVar30 = 0x1f;
          if (bVar16 != 0) {
            for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          local_208.bitsConsumed = (uVar30 ^ 0x1f) + (uint)uVar8 * -8 + 0x29;
          local_120 = (ulong *)local_208.start;
        }
        else {
          local_120 = puStack_1b0 + -1;
          local_208.bitContainer = puStack_1b0[-1];
          if (local_208.bitContainer >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar30 = 0x1f;
          bVar16 = (byte)(local_208.bitContainer >> 0x38);
          if (bVar16 != 0) {
            for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          local_208.bitsConsumed = ~uVar30 + 9;
        }
        sVar13 = local_208.bitContainer;
        local_128 = (size_t *)CONCAT44(local_128._4_4_,local_208.bitsConsumed);
        if (uVar9 == 0) {
          return 0xffffffffffffffb8;
        }
        srcBuffer = (byte *)((ulong)uVar9 + (long)puStack_1b0);
        local_1a8 = puStack_1b0 + 1;
        if (uVar9 < 8) {
          local_1c8._0_8_ = ZEXT18((byte)*puStack_1b0);
          switch(uVar9) {
          case 7:
            local_1c8._0_8_ = local_1c8._0_8_ | (ulong)*(byte *)((long)puStack_1b0 + 6) << 0x30;
          case 6:
            local_1c8._0_8_ = local_1c8._0_8_ + ((ulong)*(byte *)((long)puStack_1b0 + 5) << 0x28);
          case 5:
            local_1c8._0_8_ = local_1c8._0_8_ + ((ulong)*(byte *)((long)puStack_1b0 + 4) << 0x20);
          case 4:
            local_1c8._0_8_ = local_1c8._0_8_ + (ulong)*(byte *)((long)puStack_1b0 + 3) * 0x1000000;
          case 3:
            local_1c8._0_8_ = local_1c8._0_8_ + (ulong)*(byte *)((long)puStack_1b0 + 2) * 0x10000;
          case 2:
            local_1c8._0_8_ = local_1c8._0_8_ + (ulong)*(byte *)((long)puStack_1b0 + 1) * 0x100;
          }
          bVar16 = srcBuffer[-1];
          if (bVar16 == 0) goto LAB_002232fd;
          uVar30 = 0x1f;
          if (bVar16 != 0) {
            for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          local_1cc = (uVar30 ^ 0x1f) + (uint)uVar9 * -8 + 0x29;
          local_140 = puStack_1b0;
        }
        else {
          local_140 = (ulong *)(srcBuffer + -8);
          local_1c8._0_8_ = *(undefined8 *)(srcBuffer + -8);
          if ((ulong)local_1c8._0_8_ >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar30 = 0x1f;
          bVar16 = (byte)((ulong)local_1c8._0_8_ >> 0x38);
          if (bVar16 != 0) {
            for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          local_1cc = ~uVar30 + 9;
        }
        local_208.ptr = (char *)local_120;
        local_1d8 = local_108.ip[0];
        local_1b8 = local_140;
        local_160 = local_1c8._0_8_;
        local_150 = (ulong *)local_108.ip[2];
        local_68 = (ulong *)local_108.ip[3];
        local_58 = (ulong *)local_108.op[0];
        local_40 = local_1a8;
        local_38 = (ulong *)local_208.limitPtr;
        local_108.ip[1]._0_4_ = local_214;
        local_1c8._8_4_ = local_1cc;
        sVar15 = BIT_initDStream((BIT_DStream_t *)local_188,srcBuffer,cSrcSize - uVar17);
        puVar2 = local_110;
        if (0xffffffffffffff88 < sVar15) {
          return sVar15;
        }
        local_60 = (undefined1 *)((long)dst + (local_148 - 3));
        puVar21 = local_158;
        puVar39 = local_110;
        if ((ulong)((long)local_198 - (long)local_118) < 8) {
          local_210 = local_118;
        }
        else {
          if (local_118 < local_60) {
            local_138 = (size_t)local_188;
            local_130 = sVar13;
            if ((char)local_190 == '\0') goto LAB_00223c6d;
            uVar31 = -(int)local_190 & 0x3f;
            local_48 = (ulong)uVar31;
            local_50 = local_168;
            lVar14 = uVar20 * 3;
            uVar30 = (uint)pBStack_180;
            do {
              psVar38 = local_178;
              puVar21 = (undefined1 *)dst;
              sVar10 = (sbyte)uVar31;
              uVar23 = (ulong)((long)local_1d8 << ((byte)local_214 & 0x3f)) >> sVar10;
              uVar17 = (local_130 << ((byte)(uint)local_128 & 0x3f)) >> sVar10;
              uVar33 = (local_160 << ((byte)local_1cc & 0x3f)) >> sVar10;
              iVar11 = *(byte *)((long)DTable + uVar23 * 2 + 4) + local_214;
              uVar34 = (local_138 << ((byte)uVar30 & 0x3f)) >> sVar10;
              uVar36 = (ulong)((long)local_1d8 << ((byte)iVar11 & 0x3f)) >> sVar10;
              *puVar21 = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              iVar26 = *(byte *)((long)DTable + uVar17 * 2 + 4) + (uint)local_128;
              puVar21[uVar20] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              iVar28 = *(byte *)((long)DTable + uVar33 * 2 + 4) + local_1cc;
              puVar21[uVar20 * 2] = *(undefined1 *)((long)DTable + uVar33 * 2 + 5);
              iVar32 = *(byte *)((long)DTable + uVar34 * 2 + 4) + uVar30;
              puVar21[lVar14] = *(undefined1 *)((long)DTable + uVar34 * 2 + 5);
              uVar23 = (local_130 << ((byte)iVar26 & 0x3f)) >> sVar10;
              uVar33 = (local_160 << ((byte)iVar28 & 0x3f)) >> sVar10;
              iVar11 = (uint)*(byte *)((long)DTable + uVar36 * 2 + 4) + iVar11;
              uVar17 = (local_138 << ((byte)iVar32 & 0x3f)) >> sVar10;
              uVar34 = (ulong)((long)local_1d8 << ((byte)iVar11 & 0x3f)) >> sVar10;
              puVar21[1] = *(undefined1 *)((long)DTable + uVar36 * 2 + 5);
              iVar26 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar26;
              puVar21[uVar20 + 1] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              iVar28 = (uint)*(byte *)((long)DTable + uVar33 * 2 + 4) + iVar28;
              puVar21[uVar20 * 2 + 1] = *(undefined1 *)((long)DTable + uVar33 * 2 + 5);
              iVar32 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar32;
              puVar21[lVar14 + 1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              iVar11 = (uint)*(byte *)((long)DTable + uVar34 * 2 + 4) + iVar11;
              puVar21[2] = *(undefined1 *)((long)DTable + uVar34 * 2 + 5);
              uVar23 = (local_130 << ((byte)iVar26 & 0x3f)) >> sVar10;
              uVar17 = (local_160 << ((byte)iVar28 & 0x3f)) >> sVar10;
              iVar26 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar26;
              uVar33 = (local_138 << ((byte)iVar32 & 0x3f)) >> sVar10;
              uVar34 = (ulong)((long)local_1d8 << ((byte)iVar11 & 0x3f)) >> sVar10;
              puVar21[uVar20 + 2] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              iVar28 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar28;
              puVar21[uVar20 * 2 + 2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              iVar32 = (uint)*(byte *)((long)DTable + uVar33 * 2 + 4) + iVar32;
              puVar21[lVar14 + 2] = *(undefined1 *)((long)DTable + uVar33 * 2 + 5);
              local_214 = (uint)*(byte *)((long)DTable + uVar34 * 2 + 4) + iVar11;
              puVar21[3] = *(undefined1 *)((long)DTable + uVar34 * 2 + 5);
              uVar23 = (local_130 << ((byte)iVar26 & 0x3f)) >> sVar10;
              bVar16 = *(byte *)((long)DTable + uVar23 * 2 + 4);
              puVar21[uVar20 + 3] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (local_160 << ((byte)iVar28 & 0x3f)) >> sVar10;
              bVar4 = *(byte *)((long)DTable + uVar23 * 2 + 4);
              puVar21[uVar20 * 2 + 3] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (local_138 << ((byte)iVar32 & 0x3f)) >> sVar10;
              bVar5 = *(byte *)((long)DTable + uVar23 * 2 + 4);
              puVar21[lVar14 + 3] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              iVar11 = 3;
              if (local_150 < local_58) {
                iVar22 = 3;
                puVar24 = local_150;
              }
              else {
                if (0x40 < local_214) goto LAB_00223c4e;
                puVar24 = (ulong *)((long)local_150 - (ulong)(local_214 >> 3));
                local_214 = local_214 & 7;
                local_1d8 = (BYTE *)*puVar24;
                iVar22 = 0;
              }
              local_128._0_4_ = iVar26 + (uint)bVar16;
              if (local_38 <= local_120) {
                if (0x40 < (uint)local_128) goto LAB_00223c4e;
                local_120 = (ulong *)((long)local_120 - (ulong)((uint)local_128 >> 3));
                local_128._0_4_ = (uint)local_128 & 7;
                local_130 = *local_120;
                iVar11 = 0;
              }
              uVar30 = iVar28 + (uint)bVar4;
              iVar28 = 3;
              if (local_140 < local_40) {
                iVar26 = 3;
                local_1cc = uVar30;
              }
              else {
                if (0x40 < uVar30) goto LAB_00223c4e;
                local_140 = (ulong *)((long)local_140 - (ulong)(uVar30 >> 3));
                local_160 = *local_140;
                iVar26 = 0;
                local_1cc = uVar30 & 7;
              }
              uVar30 = iVar32 + (uint)bVar5;
              local_178 = psVar38;
              if (local_168 <= psVar38) {
                if (0x40 < uVar30) {
LAB_00223c4e:
                  local_128 = psVar38;
                  __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                                ,0x185,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
                }
                local_178 = (size_t *)((long)psVar38 - (ulong)(uVar30 >> 3));
                uVar30 = uVar30 & 7;
                local_138 = *local_178;
                iVar28 = 0;
              }
              local_150 = puVar24;
            } while ((puVar21 + lVar14 + 4 < local_60) &&
                    (dst = puVar21 + 4, ((iVar11 == 0 && iVar22 == 0) && iVar26 == 0) && iVar28 == 0
                    ));
            dst = puVar21 + 4;
            local_1c8._8_4_ = local_1cc;
            pBStack_180 = (BYTE *)CONCAT44(pBStack_180._4_4_,uVar30);
            local_1b8 = local_140;
            local_210 = (undefined1 *)((long)dst + lVar14);
            local_188 = (undefined1  [8])local_138;
            sVar13 = local_130;
            puVar21 = (undefined1 *)((long)dst + uVar20 * 2);
            puVar39 = (undefined1 *)((long)dst + uVar20);
            local_208.ptr = (char *)local_120;
            local_108.ip[2] = (BYTE *)puVar24;
            local_108.ip[1]._0_4_ = local_214;
            local_208.bitsConsumed = (uint)local_128;
          }
          else {
            local_210 = local_118;
            psVar38 = local_128;
          }
          local_128 = psVar38;
          local_108.ip[0] = local_1d8;
          local_1c8._0_8_ = local_160;
          local_208.bitContainer = sVar13;
        }
        if ((dst <= local_110) && (puVar39 <= local_158)) {
          if (local_118 < puVar21) {
            return 0xffffffffffffffec;
          }
          uVar23 = local_190;
          puVar35 = local_198;
          if ((long)local_110 - (long)dst < 4) {
            if (local_214 < 0x41) {
              if (local_150 < local_58) {
                if (local_150 != local_68) {
                  uVar30 = (int)local_150 - (int)local_68;
                  if (local_68 <= (ulong *)((long)local_150 - (ulong)(local_214 >> 3))) {
                    uVar30 = local_214 >> 3;
                  }
                  local_108.ip[2] = (BYTE *)((long)local_150 - (ulong)uVar30);
                  local_108.ip[1]._0_4_ = local_214 + uVar30 * -8;
                  local_108.ip[0] = *(BYTE **)local_108.ip[2];
                }
              }
              else {
                BIT_reloadDStreamFast((BIT_DStream_t *)&local_108);
                uVar23 = local_190;
                puVar35 = local_198;
              }
            }
          }
          else if (local_214 < 0x41) {
            puVar1 = local_110 + -3;
            local_1d8 = (BYTE *)(ulong)(-(int)local_190 & 0x3f);
            do {
              if (local_108.ip[2] < local_108.op[0]) {
                if (local_108.ip[2] == local_108.ip[3]) break;
                bVar40 = (ulong *)((long)local_108.ip[2] - (ulong)(local_214 >> 3)) <
                         local_108.ip[3];
                uVar30 = (int)local_108.ip[2] - (int)local_108.ip[3];
                if (!bVar40) {
                  uVar30 = local_214 >> 3;
                }
                BVar12 = (BIT_DStream_status)bVar40;
                local_108.ip[2] = (BYTE *)((long)local_108.ip[2] - (ulong)uVar30);
                local_108.ip[1]._0_4_ = local_214 + uVar30 * -8;
                local_108.ip[0] = *(BYTE **)local_108.ip[2];
              }
              else {
                BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)&local_108);
                uVar23 = local_190;
                puVar35 = local_198;
              }
              if ((puVar1 <= dst) || (BVar12 != BIT_DStream_unfinished)) break;
              if ((char)uVar23 == '\0') goto LAB_00223c6d;
              bVar16 = (byte)local_1d8;
              uVar17 = (ulong)((long)local_108.ip[0] << ((byte)(uint)local_108.ip[1] & 0x3f)) >>
                       (bVar16 & 0x3f);
              iVar11 = *(byte *)((long)DTable + uVar17 * 2 + 4) + (uint)local_108.ip[1];
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)((long)local_108.ip[0] << ((byte)iVar11 & 0x3f)) >> (bVar16 & 0x3f);
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)((long)local_108.ip[0] << ((byte)iVar11 & 0x3f)) >> (bVar16 & 0x3f);
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)((long)local_108.ip[0] << ((byte)iVar11 & 0x3f)) >> (bVar16 & 0x3f);
              local_214 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              dst = (void *)((long)dst + 4);
              local_108.ip[1]._0_4_ = local_214;
              if (0x40 < local_214) break;
            } while( true );
          }
          cVar29 = (char)uVar23;
          if (dst < puVar2) {
            if (cVar29 == '\0') goto LAB_00223c6d;
            do {
              uVar17 = (ulong)((long)local_108.ip[0] << ((byte)(uint)local_108.ip[1] & 0x3f)) >>
                       (-cVar29 & 0x3fU);
              local_108.ip[1]._0_4_ =
                   *(byte *)((long)DTable + uVar17 * 2 + 4) + (uint)local_108.ip[1];
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              dst = (void *)((long)dst + 1);
            } while (dst < puVar2);
          }
          if ((long)local_158 - (long)puVar39 < 4) {
            if (local_208.bitsConsumed < 0x41) {
              if (local_208.ptr < local_208.limitPtr) {
                if (local_208.ptr != local_208.start) {
                  uVar30 = (int)local_208.ptr - (int)local_208.start;
                  if (local_208.start <=
                      (ulong *)((long)local_208.ptr - (ulong)(local_208.bitsConsumed >> 3))) {
                    uVar30 = local_208.bitsConsumed >> 3;
                  }
                  local_208.ptr = (char *)((long)local_208.ptr - (ulong)uVar30);
                  local_208.bitsConsumed = local_208.bitsConsumed + uVar30 * -8;
                  local_208.bitContainer = *(size_t *)local_208.ptr;
                }
              }
              else {
                BIT_reloadDStreamFast(&local_208);
                uVar23 = local_190;
                puVar35 = local_198;
              }
            }
          }
          else if (local_208.bitsConsumed < 0x41) {
            puVar2 = local_158 + -3;
            bVar16 = -cVar29 & 0x3f;
            do {
              if (local_208.ptr < local_208.limitPtr) {
                if (local_208.ptr == local_208.start) break;
                bVar40 = (ulong *)((long)local_208.ptr - (ulong)(local_208.bitsConsumed >> 3)) <
                         local_208.start;
                uVar30 = (int)local_208.ptr - (int)local_208.start;
                if (!bVar40) {
                  uVar30 = local_208.bitsConsumed >> 3;
                }
                BVar12 = (BIT_DStream_status)bVar40;
                local_208.ptr = (char *)((long)local_208.ptr - (ulong)uVar30);
                local_208.bitsConsumed = local_208.bitsConsumed + uVar30 * -8;
                local_208.bitContainer = *(size_t *)local_208.ptr;
              }
              else {
                BVar12 = BIT_reloadDStreamFast(&local_208);
                puVar35 = local_198;
              }
              uVar23 = local_190;
              if ((puVar2 <= puVar39) || (BVar12 != BIT_DStream_unfinished)) break;
              if ((char)local_190 == '\0') goto LAB_00223c6d;
              uVar17 = (local_208.bitContainer << ((byte)local_208.bitsConsumed & 0x3f)) >> bVar16;
              iVar11 = *(byte *)((long)DTable + uVar17 * 2 + 4) + local_208.bitsConsumed;
              *puVar39 = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (local_208.bitContainer << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar39[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (local_208.bitContainer << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar39[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (local_208.bitContainer << ((byte)iVar11 & 0x3f)) >> bVar16;
              local_208.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar39[3] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              puVar39 = puVar39 + 4;
              if (0x40 < local_208.bitsConsumed) break;
            } while( true );
          }
          cVar29 = (char)uVar23;
          if (puVar39 < local_158) {
            if (cVar29 == '\0') goto LAB_00223c6d;
            do {
              uVar17 = (local_208.bitContainer << ((byte)local_208.bitsConsumed & 0x3f)) >>
                       (-cVar29 & 0x3fU);
              local_208.bitsConsumed =
                   *(byte *)((long)DTable + uVar17 * 2 + 4) + local_208.bitsConsumed;
              *puVar39 = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              puVar39 = puVar39 + 1;
            } while (puVar39 < local_158);
          }
          if ((long)local_118 - (long)puVar21 < 4) {
            if ((uint)local_1c8._8_4_ < 0x41) {
              if (local_1b8 < local_1a8) {
                if (local_1b8 != puStack_1b0) {
                  uVar30 = (int)local_1b8 - (int)puStack_1b0;
                  if (puStack_1b0 <=
                      (ulong *)((long)local_1b8 - (ulong)((uint)local_1c8._8_4_ >> 3))) {
                    uVar30 = (uint)local_1c8._8_4_ >> 3;
                  }
                  local_1b8 = (ulong *)((long)local_1b8 - (ulong)uVar30);
                  local_1c8._8_4_ = local_1c8._8_4_ + uVar30 * -8;
                  local_1c8._0_8_ = *local_1b8;
                }
              }
              else {
                BIT_reloadDStreamFast((BIT_DStream_t *)local_1c8);
                uVar23 = local_190;
                puVar35 = local_198;
              }
            }
          }
          else if ((uint)local_1c8._8_4_ < 0x41) {
            puVar2 = local_118 + -3;
            bVar16 = -cVar29 & 0x3f;
            do {
              if (local_1b8 < local_1a8) {
                if (local_1b8 == puStack_1b0) break;
                bVar40 = (ulong *)((long)local_1b8 - (ulong)((uint)local_1c8._8_4_ >> 3)) <
                         puStack_1b0;
                uVar30 = (int)local_1b8 - (int)puStack_1b0;
                if (!bVar40) {
                  uVar30 = (uint)local_1c8._8_4_ >> 3;
                }
                BVar12 = (BIT_DStream_status)bVar40;
                local_1b8 = (ulong *)((long)local_1b8 - (ulong)uVar30);
                local_1c8._8_4_ = local_1c8._8_4_ + uVar30 * -8;
                local_1c8._0_8_ = *local_1b8;
              }
              else {
                BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_1c8);
                puVar35 = local_198;
              }
              uVar23 = local_190;
              if ((puVar2 <= puVar21) || (BVar12 != BIT_DStream_unfinished)) break;
              if ((char)local_190 == '\0') goto LAB_00223c6d;
              uVar17 = (ulong)(local_1c8._0_8_ << ((byte)local_1c8._8_4_ & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + local_1c8._8_4_;
              *puVar21 = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)(local_1c8._0_8_ << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar21[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)(local_1c8._0_8_ << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar21[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)(local_1c8._0_8_ << ((byte)iVar11 & 0x3f)) >> bVar16;
              local_1c8._8_4_ = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar21[3] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              puVar21 = puVar21 + 4;
              if (0x40 < (uint)local_1c8._8_4_) break;
            } while( true );
          }
          puVar2 = local_60;
          sVar13 = local_148;
          cVar29 = (char)uVar23;
          if (puVar21 < local_118) {
            if (cVar29 == '\0') goto LAB_00223c6d;
            do {
              uVar17 = (ulong)(local_1c8._0_8_ << ((byte)local_1c8._8_4_ & 0x3f)) >>
                       (-cVar29 & 0x3fU);
              local_1c8._8_4_ = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + local_1c8._8_4_;
              *puVar21 = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              puVar21 = puVar21 + 1;
            } while (puVar21 < local_118);
          }
          if ((long)puVar35 - (long)local_210 < 4) {
            if ((uint)pBStack_180 < 0x41) {
              if (local_178 < local_168) {
                if (local_178 != psStack_170) {
                  uVar30 = (int)local_178 - (int)psStack_170;
                  if (psStack_170 <= (size_t *)((long)local_178 - (ulong)((uint)pBStack_180 >> 3)))
                  {
                    uVar30 = (uint)pBStack_180 >> 3;
                  }
                  local_178 = (size_t *)((long)local_178 - (ulong)uVar30);
                  pBStack_180 = (BYTE *)CONCAT44(pBStack_180._4_4_,(uint)pBStack_180 + uVar30 * -8);
                  local_188 = (undefined1  [8])*local_178;
                }
              }
              else {
                BIT_reloadDStreamFast((BIT_DStream_t *)local_188);
                cVar29 = (char)local_190;
                puVar35 = local_198;
              }
            }
          }
          else if ((uint)pBStack_180 < 0x41) {
            bVar16 = -cVar29 & 0x3f;
            uVar30 = (uint)pBStack_180;
            do {
              cVar29 = (char)uVar23;
              if (local_178 < local_168) {
                if (local_178 == psStack_170) break;
                bVar40 = (size_t *)((long)local_178 - (ulong)(uVar30 >> 3)) < psStack_170;
                uVar31 = (int)local_178 - (int)psStack_170;
                if (!bVar40) {
                  uVar31 = uVar30 >> 3;
                }
                BVar12 = (BIT_DStream_status)bVar40;
                local_178 = (size_t *)((long)local_178 - (ulong)uVar31);
                pBStack_180 = (BYTE *)CONCAT44(pBStack_180._4_4_,uVar30 + uVar31 * -8);
                local_188 = (undefined1  [8])*local_178;
              }
              else {
                BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_188);
                puVar35 = local_198;
              }
              cVar29 = (char)local_190;
              if ((puVar2 <= local_210) || (BVar12 != BIT_DStream_unfinished)) break;
              if (cVar29 == '\0') goto LAB_00223c6d;
              uVar23 = (ulong)((long)local_188 << ((byte)pBStack_180 & 0x3f)) >> bVar16;
              iVar11 = *(byte *)((long)DTable + uVar23 * 2 + 4) + (uint)pBStack_180;
              *local_210 = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (ulong)((long)local_188 << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
              local_210[1] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (ulong)((long)local_188 << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
              local_210[2] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (ulong)((long)local_188 << ((byte)iVar11 & 0x3f)) >> bVar16;
              uVar30 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
              pBStack_180 = (BYTE *)CONCAT44(pBStack_180._4_4_,uVar30);
              local_210[3] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              local_210 = local_210 + 4;
              uVar23 = local_190;
              if (0x40 < uVar30) break;
            } while( true );
          }
          if (local_210 < puVar35) {
            if (cVar29 == '\0') {
LAB_00223c6d:
              __assert_fail("nbBits >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                            ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
            }
            do {
              uVar23 = (ulong)((long)local_188 << ((byte)pBStack_180 & 0x3f)) >> (-cVar29 & 0x3fU);
              pBStack_180 = (BYTE *)(ulong)(*(byte *)((long)DTable + uVar23 * 2 + 4) +
                                           (uint)pBStack_180);
              *local_210 = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              local_210 = local_210 + 1;
            } while (local_210 < puVar35);
          }
          if ((uint)pBStack_180 != 0x40) {
            sVar13 = 0xffffffffffffffec;
          }
          if (local_178 != psStack_170) {
            sVar13 = 0xffffffffffffffec;
          }
          if (local_1c8._8_4_ != 0x40) {
            sVar13 = 0xffffffffffffffec;
          }
          if (local_1b8 != puStack_1b0) {
            sVar13 = 0xffffffffffffffec;
          }
          if (local_208.bitsConsumed != 0x40) {
            sVar13 = 0xffffffffffffffec;
          }
          if (local_208.ptr != local_208.start) {
            sVar13 = 0xffffffffffffffec;
          }
          if ((uint)local_108.ip[1] != 0x40) {
            sVar13 = 0xffffffffffffffec;
          }
          if (local_108.ip[2] == local_108.ip[3]) {
            return sVar13;
          }
          return 0xffffffffffffffec;
        }
        goto LAB_002232fd;
      }
    }
    sVar13 = 0xffffffffffffffb8;
  }
  return sVar13;
LAB_00222735:
  dstSize = local_148;
LAB_00222747:
  pBVar37 = local_1d8;
LAB_00222776:
  if (pBVar27 < dst) {
    lVar25 = 0;
    do {
      uVar23 = (local_208.bitContainer << ((byte)local_208.bitsConsumed & 0x3f)) >> 0x35;
      local_208.bitsConsumed = *(byte *)((long)DTable + uVar23 * 2 + 4) + local_208.bitsConsumed;
      pBVar27[lVar25] = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
      lVar25 = lVar25 + 1;
    } while ((long)dst - (long)pBVar27 != lVar25);
    pBVar19 = local_108.op[lVar14];
  }
  local_108.op[lVar14] = pBVar19 + lVar18;
  if (pBVar19 + lVar18 != (BYTE *)dst) {
    return 0xffffffffffffffec;
  }
  lVar14 = lVar14 + 1;
  if (lVar14 == 4) {
    if (dstSize != 0) {
      return dstSize;
    }
    __assert_fail("dstSize != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                  ,0x348,
                  "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
  goto LAB_002225a1;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}